

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O1

TestLog * glu::operator<<(TestLog *log,ShaderInfo *shaderInfo)

{
  LogShader local_60;
  
  tcu::LogShader::LogShader
            (&local_60,getLogShaderType::s_typeMap[shaderInfo->type],&shaderInfo->source,
             shaderInfo->compileOk,&shaderInfo->infoLog);
  tcu::TestLog::writeShader
            (log,local_60.m_type,local_60.m_source._M_dataplus._M_p,local_60.m_compileOk,
             local_60.m_infoLog._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_infoLog._M_dataplus._M_p != &local_60.m_infoLog.field_2) {
    operator_delete(local_60.m_infoLog._M_dataplus._M_p,
                    local_60.m_infoLog.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_source._M_dataplus._M_p != &local_60.m_source.field_2) {
    operator_delete(local_60.m_source._M_dataplus._M_p,
                    local_60.m_source.field_2._M_allocated_capacity + 1);
  }
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const ShaderInfo& shaderInfo)
{
	return log << tcu::TestLog::Shader(getLogShaderType(shaderInfo.type), shaderInfo.source, shaderInfo.compileOk, shaderInfo.infoLog);
}